

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDHPrivateKey.cpp
# Opt level: O0

void __thiscall OSSLDHPrivateKey::OSSLDHPrivateKey(OSSLDHPrivateKey *this,DH *inDH)

{
  undefined8 in_RSI;
  long *in_RDI;
  DHPrivateKey *unaff_retaddr;
  
  DHPrivateKey::DHPrivateKey(unaff_retaddr);
  *in_RDI = (long)&PTR_serialise_0017b608;
  in_RDI[0x10] = 0;
  (**(code **)(*in_RDI + 0x78))(in_RDI,in_RSI);
  return;
}

Assistant:

OSSLDHPrivateKey::OSSLDHPrivateKey(const DH* inDH)
{
	dh = NULL;

	setFromOSSL(inDH);
}